

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

void unpack14(uint8_t *b,uint16_t *s)

{
  short sVar1;
  byte bVar2;
  int i;
  uint16_t bias;
  uint16_t shift;
  uint16_t *s_local;
  uint8_t *b_local;
  
  *s = CONCAT11(*b,b[1]);
  bVar2 = (byte)((int)(uint)b[2] >> 2);
  sVar1 = (short)(0x20 << (bVar2 & 0x1f));
  s[4] = (*s + (short)(((b[2] & 3) << 4 | (int)(uint)b[3] >> 4) << (bVar2 & 0x1f))) - sVar1;
  s[8] = (s[4] + (short)(((b[3] & 0xf) << 2 | (int)(uint)b[4] >> 6) << (bVar2 & 0x1f))) - sVar1;
  s[0xc] = (s[8] + (short)((b[4] & 0x3f) << (bVar2 & 0x1f))) - sVar1;
  s[1] = (*s + (short)(((int)(uint)b[5] >> 2) << (bVar2 & 0x1f))) - sVar1;
  s[5] = (s[4] + (short)(((b[5] & 3) << 4 | (int)(uint)b[6] >> 4) << (bVar2 & 0x1f))) - sVar1;
  s[9] = (s[8] + (short)(((b[6] & 0xf) << 2 | (int)(uint)b[7] >> 6) << (bVar2 & 0x1f))) - sVar1;
  s[0xd] = (s[0xc] + (short)((b[7] & 0x3f) << (bVar2 & 0x1f))) - sVar1;
  s[2] = (s[1] + (short)(((int)(uint)b[8] >> 2) << (bVar2 & 0x1f))) - sVar1;
  s[6] = (s[5] + (short)(((b[8] & 3) << 4 | (int)(uint)b[9] >> 4) << (bVar2 & 0x1f))) - sVar1;
  s[10] = (s[9] + (short)(((b[9] & 0xf) << 2 | (int)(uint)b[10] >> 6) << (bVar2 & 0x1f))) - sVar1;
  s[0xe] = (s[0xd] + (short)((b[10] & 0x3f) << (bVar2 & 0x1f))) - sVar1;
  s[3] = (s[2] + (short)(((int)(uint)b[0xb] >> 2) << (bVar2 & 0x1f))) - sVar1;
  s[7] = (s[6] + (short)(((b[0xb] & 3) << 4 | (int)(uint)b[0xc] >> 4) << (bVar2 & 0x1f))) - sVar1;
  s[0xb] = (s[10] + (short)(((b[0xc] & 0xf) << 2 | (int)(uint)b[0xd] >> 6) << (bVar2 & 0x1f))) -
           sVar1;
  s[0xf] = (s[0xe] + (short)((b[0xd] & 0x3f) << (bVar2 & 0x1f))) - sVar1;
  for (i = 0; i < 0x10; i = i + 1) {
    if ((s[i] & 0x8000) == 0) {
      s[i] = s[i] ^ 0xffff;
    }
    else {
      s[i] = s[i] & 0x7fff;
    }
  }
  return;
}

Assistant:

static inline void
unpack14 (const uint8_t b[14], uint16_t s[16])
{
    uint16_t shift, bias;
    s[0] = ((uint16_t) (b[0] << 8)) | ((uint16_t) b[1]);

    shift = (b[2] >> 2);
    bias  = (uint16_t) (0x20u << shift);

    s[4]  = (uint16_t) ((uint32_t) s[0] +
                       (uint32_t) ((((uint32_t) (b[2] << 4) |
                                     (uint32_t) (b[3] >> 4)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[8]  = (uint16_t) ((uint32_t) s[4] +
                       (uint32_t) ((((uint32_t) (b[3] << 2) |
                                     (uint32_t) (b[4] >> 6)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[12] = (uint16_t) ((uint32_t) s[8] +
                        (uint32_t) ((uint32_t) (b[4] & 0x3fu) << shift) - bias);

    s[1]  = (uint16_t) ((uint32_t) s[0] +
                       (uint32_t) ((uint32_t) (b[5] >> 2) << shift) - bias);
    s[5]  = (uint16_t) ((uint32_t) s[4] +
                       (uint32_t) ((((uint32_t) (b[5] << 4) |
                                     (uint32_t) (b[6] >> 4)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[9]  = (uint16_t) ((uint32_t) s[8] +
                       (uint32_t) ((((uint32_t) (b[6] << 2) |
                                     (uint32_t) (b[7] >> 6)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[13] = (uint16_t) ((uint32_t) s[12] +
                        (uint32_t) ((uint32_t) (b[7] & 0x3fu) << shift) - bias);

    s[2]  = (uint16_t) ((uint32_t) s[1] +
                       (uint32_t) ((uint32_t) (b[8] >> 2) << shift) - bias);
    s[6]  = (uint16_t) ((uint32_t) s[5] +
                       (uint32_t) ((((uint32_t) (b[8] << 4) |
                                     (uint32_t) (b[9] >> 4)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[10] = (uint16_t) ((uint32_t) s[9] +
                        (uint32_t) ((((uint32_t) (b[9] << 2) |
                                      (uint32_t) (b[10] >> 6)) &
                                     0x3fu)
                                    << shift) -
                        bias);
    s[14] =
        (uint16_t) ((uint32_t) s[13] +
                    (uint32_t) ((uint32_t) (b[10] & 0x3fu) << shift) - bias);

    s[3]  = (uint16_t) ((uint32_t) s[2] +
                       (uint32_t) ((uint32_t) (b[11] >> 2) << shift) - bias);
    s[7]  = (uint16_t) ((uint32_t) s[6] +
                       (uint32_t) ((((uint32_t) (b[11] << 4) |
                                     (uint32_t) (b[12] >> 4)) &
                                    0x3fu)
                                   << shift) -
                       bias);
    s[11] = (uint16_t) ((uint32_t) s[10] +
                        (uint32_t) ((((uint32_t) (b[12] << 2) |
                                      (uint32_t) (b[13] >> 6)) &
                                     0x3fu)
                                    << shift) -
                        bias);
    s[15] =
        (uint16_t) ((uint32_t) s[14] +
                    (uint32_t) ((uint32_t) (b[13] & 0x3fu) << shift) - bias);

    for (int i = 0; i < 16; ++i)
    {
        if (s[i] & 0x8000)
            s[i] &= 0x7fff;
        else
            s[i] = ~s[i];
    }
}